

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  uint uVar1;
  bool bVar2;
  Message *this_00;
  uint uVar3;
  bool bVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  string local_1f8;
  string error_message;
  string local_1b8;
  ostringstream stream;
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(&error_message,this);
  Message::Message((Message *)&local_200);
  std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"Death test: ");
  _stream = this->statement_;
  this_00 = Message::operator<<((Message *)&local_200,(char **)&stream);
  Message::operator<<(this_00,(char (*) [2])0x1601ce);
  switch(this->outcome_) {
  case DIED:
    if (!status_ok) {
      std::operator<<((ostream *)(local_200._M_head_impl + 0x10),
                      "    Result: died but not with expected exit code:\n");
      std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"            ");
      uVar1 = this->status_;
      Message::Message((Message *)&local_1f8);
      uVar3 = uVar1 & 0x7f;
      if (uVar3 == 0) {
        std::operator<<((ostream *)(local_1f8._M_dataplus._M_p + 0x10),"Exited with exit status ");
        std::ostream::operator<<((ostream *)(local_1f8._M_dataplus._M_p + 0x10),uVar1 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar3 * 0x1000000 + 0x1000000)) {
        std::operator<<((ostream *)(local_1f8._M_dataplus._M_p + 0x10),"Terminated by signal ");
        std::ostream::operator<<((ostream *)(local_1f8._M_dataplus._M_p + 0x10),uVar3);
      }
      if ((char)uVar1 < '\0') {
        std::operator<<((ostream *)(local_1f8._M_dataplus._M_p + 0x10)," (core dumped)");
      }
      StringStreamToString((string *)&stream,(stringstream *)local_1f8._M_dataplus._M_p);
      if ((stringstream *)local_1f8._M_dataplus._M_p != (stringstream *)0x0) {
        (**(code **)(*(long *)local_1f8._M_dataplus._M_p + 8))(local_1f8._M_dataplus._M_p);
      }
      std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&stream);
      std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"\n");
      std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"Actual msg:\n");
      FormatDeathTestOutput(&local_1f8,&error_message);
      std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      break;
    }
    bVar2 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            ::Matches(&(this->matcher_).
                       super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      ,&error_message);
    bVar4 = true;
    if (bVar2) goto LAB_00138b43;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::DescribeTo(&(this->matcher_).
                  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ,(ostream *)&stream);
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),
                    "    Result: died but not with expected error.\n");
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"  Expected: ");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&local_1f8);
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"\n");
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"Actual msg:\n");
    FormatDeathTestOutput(&local_1b8,&error_message);
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
    goto LAB_00138b41;
  case LIVED:
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"    Result: failed to die.\n");
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10)," Error msg:\n");
    FormatDeathTestOutput((string *)&stream,&error_message);
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&stream);
    break;
  case RETURNED:
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),
                    "    Result: illegal return in test statement.\n");
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10)," Error msg:\n");
    FormatDeathTestOutput((string *)&stream,&error_message);
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&stream);
    break;
  case THREW:
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),"    Result: threw an exception.\n");
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10)," Error msg:\n");
    FormatDeathTestOutput((string *)&stream,&error_message);
    std::operator<<((ostream *)(local_200._M_head_impl + 0x10),(string *)&stream);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)&stream,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/XQP-Munich[P]LDPC4QKD/build_O2/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x265);
    std::operator<<((ostream *)&std::cerr,
                    "DeathTest::Passed somehow called before conclusion of test");
    GTestLog::~GTestLog((GTestLog *)&stream);
    goto LAB_00138b41;
  }
  std::__cxx11::string::~string((string *)&stream);
LAB_00138b41:
  bVar4 = false;
LAB_00138b43:
  StringStreamToString((string *)&stream,local_200._M_head_impl);
  DeathTest::set_last_death_test_message((string *)&stream);
  std::__cxx11::string::~string((string *)&stream);
  if (local_200._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_200._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)&error_message);
  return bVar4;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned())
    return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n" << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n" << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}